

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall
Fl_Text_Buffer::findchar_backward(Fl_Text_Buffer *this,int startPos,uint searchChar,int *foundPos)

{
  uint uVar1;
  int *foundPos_local;
  uint searchChar_local;
  int startPos_local;
  Fl_Text_Buffer *this_local;
  
  if (startPos < 1) {
    *foundPos = 0;
  }
  else {
    foundPos_local._4_4_ = startPos;
    if (this->mLength < startPos) {
      foundPos_local._4_4_ = this->mLength;
    }
    for (foundPos_local._4_4_ = prev_char(this,foundPos_local._4_4_); -1 < foundPos_local._4_4_;
        foundPos_local._4_4_ = prev_char(this,foundPos_local._4_4_)) {
      uVar1 = char_at(this,foundPos_local._4_4_);
      if (searchChar == uVar1) {
        *foundPos = foundPos_local._4_4_;
        return 1;
      }
    }
    *foundPos = 0;
  }
  return 0;
}

Assistant:

int Fl_Text_Buffer::findchar_backward(int startPos, unsigned int searchChar,
				      int *foundPos) const {
  if (startPos <= 0) {
    *foundPos = 0;
    return 0;
  }
  
  if (startPos > mLength)
    startPos = mLength;
  
  for (startPos = prev_char(startPos); startPos>=0; startPos = prev_char(startPos)) {
    if (searchChar == char_at(startPos)) {
      *foundPos = startPos;
      return 1;
    }
  }
  
  *foundPos = 0;
  return 0;
}